

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derLDec(size_t *len,octet *der,size_t count)

{
  ulong uVar1;
  size_t r;
  size_t l;
  size_t l_count;
  size_t count_local;
  octet *der_local;
  size_t *len_local;
  
  l_count = 1;
  if (((count == 0) || (*der == 0x80)) || (*der == 0xff)) {
    return 0xffffffffffffffff;
  }
  if (*der < 0x80) {
    l = (size_t)*der;
  }
  else {
    uVar1 = (ulong)(int)(*der - 0x80);
    l_count = uVar1 + 1;
    if (((count < l_count) || (8 < uVar1)) ||
       ((der[1] == '\0' || ((uVar1 == 1 && (der[1] < 0x80)))))) {
      return 0xffffffffffffffff;
    }
    l = 0;
    for (r = 1; r < l_count; r = r + 1) {
      l = (ulong)der[r] | l << 8;
    }
    if (l == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
  }
  if (len != (size_t *)0x0) {
    *len = l;
  }
  return l_count;
}

Assistant:

static size_t derLDec(size_t* len, const octet der[], size_t count)
{
	size_t l_count = 1;
	size_t l;
	// не хватает буфера? неявная форма (0x80)? запрещенный октет (0xFF)?
	if (count < l_count || der[0] == 128 || der[0] == 255)
		return SIZE_MAX;
	// короткая форма?
	if (der[0] < 128)
		l = der[0];
	// длинная форма
	else
	{
		size_t r = der[0] - 128;
		l_count += r;
		// не хватает буфера? переполнение?
		// нулевой старший октет кода длины?
		// длина меньше 128?
		if (count < l_count || r > O_PER_S ||
			der[1] == 0 || 
			r == 1 && der[1] < 128)
			return SIZE_MAX;
		for (l = 0, r = 1; r < l_count; ++r)
			 l <<= 8, l |= (size_t)der[r];
		// переполнение?
		if (l == SIZE_MAX)
			return SIZE_MAX;
	}
	// возврат
	if (len)
	{
		ASSERT(memIsValid(len, sizeof(size_t)));
		*len = l;
	}
	return l_count;
}